

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

QScroller * __thiscall
QMap<QObject_*,_QScroller_*>::value
          (QMap<QObject_*,_QScroller_*> *this,QObject **key,QScroller **defaultValue)

{
  QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
  *pQVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
                 *)0x0) {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var2 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var2->_M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        if (*(QObject **)(p_Var4 + 1) >= *key) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(QObject **)(p_Var4 + 1) < *key];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    p_Var4 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var4 = p_Var3, *key < *(QObject **)(p_Var3 + 1))
       ) {
      p_Var4 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 != p_Var2) {
      defaultValue = (QScroller **)&p_Var4[1]._M_parent;
    }
  }
  return (QScroller *)(_Base_ptr)*defaultValue;
}

Assistant:

constexpr P get() const noexcept { return ptr; }